

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp1.c
# Opt level: O0

void Putchar(Global *global,int c)

{
  int in_ESI;
  long in_RDI;
  
  if (*(char *)(in_RDI + 0xba4) != '\0') {
    if (*(long *)(in_RDI + 0xb78) == 0) {
      putchar(in_ESI);
    }
    else {
      (**(code **)(in_RDI + 0xb78))(in_ESI,*(undefined8 *)(in_RDI + 0xb70));
    }
  }
  return;
}

Assistant:

void Putchar(struct Global *global, int c)
{
  /*
   * Output one character to stdout or to output function!
   */
  if(!global->out)
    return;
#if defined(unix)
  if(global->output)
    global->output(c, global->userdata);
  else
    putchar(c);
#else /* amiga */
  global->output(c, global->userdata);
#endif
}